

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
AsyncRgbLedAnalyzerSettings::LoadSettings(AsyncRgbLedAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  U32 controllerInt;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&controllerInt);
  this->mLEDController = controllerInt;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    U32 controllerInt;
    text_archive >> mInputChannel;
    text_archive >> controllerInt;
    mLEDController = static_cast<Controller>( controllerInt );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}